

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

int clampvar(ident *id,int val,int minval,int maxval)

{
  char *local_30;
  int maxval_local;
  int minval_local;
  int val_local;
  ident *id_local;
  
  maxval_local = minval;
  if ((val < minval) || (maxval_local = maxval, id_local._4_4_ = val, maxval < val)) {
    if ((id->flags & 4U) == 0) {
      local_30 = "valid range for %s is %d..%d";
    }
    else {
      local_30 = "valid range for %s is 0x%X..0x%X";
      if (minval < 0x100) {
        local_30 = "valid range for %s is %d..0x%X";
      }
    }
    debugcode(local_30,id->name,(ulong)(uint)minval,(ulong)(uint)maxval);
    id_local._4_4_ = maxval_local;
  }
  return id_local._4_4_;
}

Assistant:

int clampvar(ident *id, int val, int minval, int maxval)
{
    if(val < minval) val = minval;
    else if(val > maxval) val = maxval;
    else return val;
    debugcode(id->flags&IDF_HEX ?
            (minval <= 255 ? "valid range for %s is %d..0x%X" : "valid range for %s is 0x%X..0x%X") :
            "valid range for %s is %d..%d",
        id->name, minval, maxval);
    return val;
}